

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  uint uVar4;
  int in_EDX;
  stbi_uc *in_RSI;
  stbi_uc val;
  int len;
  int nleft;
  int count;
  stbi__context *in_stack_ffffffffffffffc8;
  int local_28;
  int local_20;
  stbi_uc *local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  while( true ) {
    do {
      while( true ) {
        do {
          iVar3 = in_EDX - local_20;
          if (iVar3 < 1) {
            return 1;
          }
          bVar1 = stbi__get8(in_stack_ffffffffffffffc8);
          uVar4 = (uint)bVar1;
        } while (uVar4 == 0x80);
        if (0x7f < uVar4) break;
        local_28 = uVar4 + 1;
        if (iVar3 < local_28) {
          return 0;
        }
        local_20 = local_28 + local_20;
        for (; local_28 != 0; local_28 = local_28 + -1) {
          sVar2 = stbi__get8(in_stack_ffffffffffffffc8);
          *local_18 = sVar2;
          local_18 = local_18 + 4;
        }
      }
    } while (uVar4 < 0x81);
    local_28 = 0x101 - uVar4;
    if (iVar3 < local_28) break;
    sVar2 = stbi__get8(in_stack_ffffffffffffffc8);
    local_20 = local_28 + local_20;
    for (; local_28 != 0; local_28 = local_28 + -1) {
      *local_18 = sVar2;
      local_18 = local_18 + 4;
    }
  }
  return 0;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount)
{
   int count, nleft, len;

   count = 0;
   while ((nleft = pixelCount - count) > 0) {
      len = stbi__get8(s);
      if (len == 128) {
         // No-op.
      } else if (len < 128) {
         // Copy next len+1 bytes literally.
         len++;
         if (len > nleft) return 0; // corrupt data
         count += len;
         while (len) {
            *p = stbi__get8(s);
            p += 4;
            len--;
         }
      } else if (len > 128) {
         stbi_uc   val;
         // Next -len+1 bytes in the dest are replicated from next source byte.
         // (Interpret len as a negative 8-bit int.)
         len = 257 - len;
         if (len > nleft) return 0; // corrupt data
         val = stbi__get8(s);
         count += len;
         while (len) {
            *p = val;
            p += 4;
            len--;
         }
      }
   }

   return 1;
}